

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Storage::Encodings::MFM::Parser::install_track(Parser *this,Address *address)

{
  element_type *peVar1;
  iterator iVar2;
  shared_ptr<Storage::Disk::Track> track;
  map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
  sectors_by_id;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
  local_90;
  Track *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Rb_tree<int,_std::pair<const_int,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
  local_50;
  
  iVar2 = std::
          _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>_>
          ::find(&(this->sectors_by_address_by_track_)._M_t,address);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->sectors_by_address_by_track_)._M_t._M_impl.super__Rb_tree_header) {
    peVar1 = (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar1->_vptr_Disk[4])(&local_60,peVar1,*address);
    if (local_60 != (Track *)0x0) {
      local_50._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_50._M_impl.super__Rb_tree_header._M_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_50._M_impl.super__Rb_tree_header._M_header._M_right =
           local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((this->density_).super__Optional_base<Storage::Encodings::MFM::Density,_true,_true>.
          _M_payload.super__Optional_payload_base<Storage::Encodings::MFM::Density>._M_engaged ==
          true) {
        parse_track((SectorMap *)&local_90,local_60,
                    (this->density_).
                    super__Optional_base<Storage::Encodings::MFM::Density,_true,_true>._M_payload.
                    super__Optional_payload_base<Storage::Encodings::MFM::Density>._M_payload.
                    _M_value);
        append((SectorMap *)&local_90,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)&local_50);
      }
      else {
        parse_track((SectorMap *)&local_90,local_60,Single);
        append((SectorMap *)&local_90,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)&local_50);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
        ::~_Rb_tree(&local_90);
        parse_track((SectorMap *)&local_90,local_60,Double);
        append((SectorMap *)&local_90,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)&local_50);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
        ::~_Rb_tree(&local_90);
        parse_track((SectorMap *)&local_90,local_60,High);
        append((SectorMap *)&local_90,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)&local_50);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<Storage::Disk::Track::Address,std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>,std::_Select1st<std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>>>
      ::
      _M_emplace_unique<Storage::Disk::Track::Address_const&,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>
                ((_Rb_tree<Storage::Disk::Track::Address,std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>,std::_Select1st<std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>>>
                  *)&this->sectors_by_address_by_track_,address,
                 (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                  *)&local_50);
      std::
      _Rb_tree<int,_std::pair<const_int,_Storage::Encodings::MFM::Sector>,_std::_Select1st<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
      ::~_Rb_tree(&local_50);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

void Parser::install_track(const Storage::Disk::Track::Address &address) {
	if(sectors_by_address_by_track_.find(address) != sectors_by_address_by_track_.end()) {
		return;
	}

	const auto track = disk_->get_track_at_position(address);
	if(!track) {
		return;
	}

	std::map<int, Storage::Encodings::MFM::Sector> sectors_by_id;
	if(density_) {
		append(parse_track(*track, *density_), sectors_by_id);
	} else {
		// Just try all three in succession.
		append(parse_track(*track, Density::Single), sectors_by_id);
		append(parse_track(*track, Density::Double), sectors_by_id);
		append(parse_track(*track, Density::High), sectors_by_id);
	}

	sectors_by_address_by_track_.emplace(address, std::move(sectors_by_id));
}